

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSense.c
# Opt level: O3

Vec_Int_t * Abc_NtkSensitivity(Abc_Ntk_t *pNtk,int nConfLim,int fVerbose)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *p;
  int *piVar3;
  ProgressBar *p_00;
  int nItemsCur;
  long lVar4;
  Abc_Ntk_t *pMiter;
  Prove_Params_t Params;
  Abc_Ntk_t *local_a0;
  int local_94;
  Abc_Ntk_t *local_90;
  Prove_Params_t local_88;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcSense.c"
                  ,0xa8,"Vec_Int_t *Abc_NtkSensitivity(Abc_Ntk_t *, int, int)");
  }
  local_94 = fVerbose;
  if (pNtk->nObjCounts[8] != 0) {
    __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcSense.c"
                  ,0xa9,"Vec_Int_t *Abc_NtkSensitivity(Abc_Ntk_t *, int, int)");
  }
  Prove_ParamsSetDefault(&local_88);
  local_88.nItersMax = 3;
  local_88.nMiteringLimitLast = nConfLim;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar3 = (int *)malloc(400);
  p->pArray = piVar3;
  p_00 = Extra_ProgressBarStart(_stdout,pNtk->vCis->nSize);
  if (0 < pNtk->vCis->nSize) {
    nItemsCur = 0;
    local_90 = pNtk;
    do {
      if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= nItemsCur)) {
        Extra_ProgressBarUpdate_int(p_00,nItemsCur,(char *)0x0);
      }
      local_a0 = Abc_NtkSensitivityMiter(pNtk,nItemsCur);
      iVar2 = Abc_NtkIvyProve(&local_a0,&local_88);
      if (iVar2 == -1) {
LAB_00305493:
        Vec_IntPush(p,nItemsCur);
      }
      else if (iVar2 == 0) {
        piVar3 = Abc_NtkVerifySimulatePattern(local_a0,local_a0->pModel);
        if (*piVar3 != 1) {
          puts("ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.");
        }
        free(piVar3);
        pNtk = local_90;
        goto LAB_00305493;
      }
      Abc_NtkDelete(local_a0);
      nItemsCur = nItemsCur + 1;
    } while (nItemsCur < pNtk->vCis->nSize);
  }
  Extra_ProgressBarStop(p_00);
  if (local_94 != 0) {
    uVar1 = p->nSize;
    printf("The outputs are sensitive to %d (out of %d) inputs:\n",(ulong)uVar1,
           (ulong)(uint)pNtk->vCis->nSize);
    if (0 < (long)(int)uVar1) {
      piVar3 = p->pArray;
      lVar4 = 0;
      do {
        printf("%d ",(ulong)(uint)piVar3[lVar4]);
        lVar4 = lVar4 + 1;
      } while ((int)uVar1 != lVar4);
    }
    putchar(10);
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkSensitivity( Abc_Ntk_t * pNtk, int nConfLim, int fVerbose )
{
    ProgressBar * pProgress;
    Prove_Params_t Params, * pParams = &Params;
    Vec_Int_t * vResult = NULL;
    Abc_Ntk_t * pMiter;
    Abc_Obj_t * pObj;
    int RetValue, i;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkLatchNum(pNtk) == 0 );
    // set up solving parameters
    Prove_ParamsSetDefault( pParams );
    pParams->nItersMax = 3;
    pParams->nMiteringLimitLast = nConfLim;
    // iterate through the PIs
    vResult = Vec_IntAlloc( 100 );
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkCiNum(pNtk) );
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // generate the sensitivity miter
        pMiter = Abc_NtkSensitivityMiter( pNtk, i );
        // solve the miter using CEC engine
        RetValue = Abc_NtkIvyProve( &pMiter, pParams );
        if ( RetValue == -1 ) // undecided
            Vec_IntPush( vResult, i );
        else if ( RetValue == 0 )
        {
            int * pSimInfo = Abc_NtkVerifySimulatePattern( pMiter, pMiter->pModel );
            if ( pSimInfo[0] != 1 )
                printf( "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n" );
//            else
//                printf( "Networks are NOT EQUIVALENT.\n" );
            ABC_FREE( pSimInfo );
            Vec_IntPush( vResult, i );
        }
        Abc_NtkDelete( pMiter );
    }
    Extra_ProgressBarStop( pProgress );
    if ( fVerbose )
    {
        printf( "The outputs are sensitive to %d (out of %d) inputs:\n", 
            Vec_IntSize(vResult), Abc_NtkCiNum(pNtk) );
        Vec_IntForEachEntry( vResult, RetValue, i )
            printf( "%d ", RetValue );
        printf( "\n" );
    }
    return vResult;
}